

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.cpp
# Opt level: O1

BOOLEAN __thiscall BVFixed::TestAndSet(BVFixed *this,BVIndex i)

{
  BVFixed BVar1;
  uint index;
  
  AssertRange(this,i);
  AssertRange(this,i);
  index = i & 0x3f;
  BVUnitT<unsigned_long>::AssertRange(index);
  BVar1 = this[(ulong)(i >> 6) + 1];
  BVUnitT<unsigned_long>::AssertRange(index);
  this[(ulong)(i >> 6) + 1] = (BVFixed)((ulong)this[(ulong)(i >> 6) + 1] | 1L << (sbyte)index);
  return ((ulong)BVar1 >> ((ulong)i & 0x3f) & 1) != 0;
}

Assistant:

BOOLEAN
BVFixed::TestAndSet(BVIndex i)
{
    AssertRange(i);
    BVUnit * bvUnit = this->BitsFromIndex(i);
    BVIndex offset = BVUnit::Offset(i);
    BOOLEAN bit = bvUnit->Test(offset);
    bvUnit->Set(offset);
    return bit;
}